

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O2

void __thiscall
FullSphere_Reintersect_Test::~FullSphere_Reintersect_Test(FullSphere_Reintersect_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FullSphere, Reintersect) {
    ParallelFor(0, nReintersect, [](int64_t i) {
        RNG rng(i);
        Transform identity;
        Float radius = pExp(rng, 4);
        Float zMin = -radius;
        Float zMax = radius;
        Float phiMax = 360;
        Sphere sphere(&identity, &identity, false, radius, zMin, zMax, phiMax);
        EXPECT_EQ(0, TestReintersectConvex(&sphere, rng)) << i;

        Transform tr = randomTransform(rng);
        Transform ti = Inverse(tr);
        Sphere tsphere(&tr, &ti, false, radius, zMin, zMax, phiMax);
        EXPECT_EQ(0, TestReintersectConvex(&tsphere, rng)) << i << ", tr " << tr;
    });
}